

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratches.cpp
# Opt level: O3

bool test_scratches(void)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  iterator __begin1;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> nums;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> local_50;
  int local_38 [8];
  
  local_38[4] = 9;
  local_38[5] = 0x17;
  local_38[6] = 0x22;
  local_38[7] = 0x38;
  local_38[0] = 1;
  local_38[1] = 3;
  local_38[2] = 4;
  local_38[3] = 6;
  __l._M_len = 8;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,&local_51);
  if ((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    lVar2 = (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar4 = 0;
    iVar5 = 0;
    do {
      if ((local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar4] & 1U) == 0) {
        iVar1 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar5];
        local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar5] =
             local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar4];
        local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar4] = iVar1;
        iVar5 = iVar5 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
  }
  do {
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        *local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start + 1;
  } while( true );
}

Assistant:

bool test_scratches(){
    vector<int> nums{1,3,4,6,9,23,34,56};
    for(int last_nonzero_idx=0,cur=0;cur < nums.size();cur++){
        if(nums[cur] %2 == 0)
            swap(nums[last_nonzero_idx++],nums[cur]);
    }

    for (int item:nums){
        cout << item << " ";
    }
}